

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O2

int FmsDomainAddEntities
              (FmsDomain domain,FmsEntityType type,int **reordering,FmsIntType ent_id_type,
              void *ents,FmsInt num_ents)

{
  ulong uVar1;
  FmsIntType dst_type;
  FmsInt tuple_size;
  int iVar2;
  void *dst;
  
  if (domain == (FmsDomain)0x0) {
    iVar2 = 1;
  }
  else {
    if (0xfffffff8 < type - FMS_NUM_ENTITY_TYPES) {
      uVar1 = domain->num_entities[type] + num_ents;
      if (domain->entities_caps[type] < uVar1) {
        iVar2 = 3;
      }
      else {
        dst_type = domain->side_ids_type[type];
        tuple_size = FmsEntityNumSides[type];
        dst = (void *)(domain->num_entities[type] * FmsIntTypeSize[dst_type] * tuple_size +
                      (long)domain->entities[type]);
        if ((reordering == (int **)0x0) || (reordering[type] == (int *)0x0)) {
          FmsIntConvertCopy(ent_id_type,ents,dst_type,dst,tuple_size * num_ents);
        }
        else {
          FmsIntPermuteConvertCopy
                    (ent_id_type,ents,dst_type,dst,reordering[type],tuple_size,num_ents * tuple_size
                    );
        }
        domain->num_entities[type] = uVar1;
        iVar2 = 0;
      }
      return iVar2;
    }
    iVar2 = 2;
  }
  return iVar2;
}

Assistant:

int FmsDomainAddEntities(FmsDomain domain, FmsEntityType type,
                         FmsEntityReordering reordering, FmsIntType ent_id_type,
                         const void *ents, FmsInt num_ents) {
  if (!domain) { E_RETURN(1); }
  if (type == FMS_VERTEX || type >= FMS_NUM_ENTITY_TYPES) { E_RETURN(2); }
  const FmsInt num_entities = domain->num_entities[type];
  if (num_entities + num_ents > domain->entities_caps[type]) { E_RETURN(3); }
  const FmsIntType side_ids_type = domain->side_ids_type[type];
  const size_t sizeof_side_ids = FmsIntTypeSize[side_ids_type];
  const FmsInt num_sides = FmsEntityNumSides[type];
  void *ents_dst = (char*)(domain->entities[type]) +
                   num_entities*num_sides*sizeof_side_ids;
  const int *perm = reordering ? reordering[type] : NULL;
  if (perm == NULL) {
    FmsIntConvertCopy(ent_id_type, ents, side_ids_type, ents_dst,
                      num_ents*num_sides);
  } else {
    FmsIntPermuteConvertCopy(ent_id_type, ents, side_ids_type, ents_dst,
                             perm, num_sides, num_ents*num_sides);
  }
  domain->num_entities[type] = num_entities + num_ents;
  return 0;
}